

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void leveldb::log::_Test_BadLength::_RunIt(void)

{
  undefined1 local_98 [8];
  _Test_BadLength t;
  
  _Test_BadLength((_Test_BadLength *)local_98);
  _Run((_Test_BadLength *)local_98);
  ~_Test_BadLength((_Test_BadLength *)local_98);
  return;
}

Assistant:

TEST(LogTest, BadLength) {
  const int kPayloadSize = kBlockSize - kHeaderSize;
  Write(BigString("bar", kPayloadSize));
  Write("foo");
  // Least significant size byte is stored in header[4].
  IncrementByte(4, 1);
  ASSERT_EQ("foo", Read());
  ASSERT_EQ(kBlockSize, DroppedBytes());
  ASSERT_EQ("OK", MatchError("bad record length"));
}